

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Errors.hpp
# Opt level: O2

void Diligent::LogError<true,char[41],char[54]>
               (bool IsFatal,char *Function,char *FullFilePath,int Line,char (*Args) [41],
               char (*Args_1) [54])

{
  long lVar1;
  ostream *poVar2;
  undefined4 in_register_0000000c;
  char (*Args_1_00) [54];
  char *pcVar3;
  string Msg;
  string FileName;
  
  Args_1_00 = (char (*) [54])CONCAT44(in_register_0000000c,Line);
  std::__cxx11::string::string((string *)&FileName,FullFilePath,(allocator *)&Msg);
  lVar1 = std::__cxx11::string::find_last_of((char *)&FileName,0x6d0137);
  if (lVar1 != -1) {
    std::__cxx11::string::erase((ulong)&FileName,0);
  }
  FormatString<char[41],char[54]>(&Msg,(Diligent *)Args,(char (*) [41])Args_1,Args_1_00);
  if (DebugMessageCallback == (undefined *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Diligent Engine: ");
    pcVar3 = "Error";
    if (IsFatal) {
      pcVar3 = "Fatal Error";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," in ");
    poVar2 = std::operator<<(poVar2,Function);
    poVar2 = std::operator<<(poVar2,"() (");
    poVar2 = std::operator<<(poVar2,(string *)&FileName);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,Line);
    poVar2 = std::operator<<(poVar2,"): ");
    poVar2 = std::operator<<(poVar2,(string *)&Msg);
    std::operator<<(poVar2,'\n');
  }
  else {
    (*(code *)DebugMessageCallback)
              (IsFatal | 2,Msg._M_dataplus._M_p,Function,FileName._M_dataplus._M_p,Line);
  }
  ThrowIf<true>(&Msg);
  std::__cxx11::string::~string((string *)&Msg);
  std::__cxx11::string::~string((string *)&FileName);
  return;
}

Assistant:

void LogError(bool IsFatal, const char* Function, const char* FullFilePath, int Line, const ArgsType&... Args)
{
    std::string FileName(FullFilePath);

    auto LastSlashPos = FileName.find_last_of("/\\");
    if (LastSlashPos != std::string::npos)
        FileName.erase(0, LastSlashPos + 1);
    auto Msg = FormatString(Args...);
    if (DebugMessageCallback != nullptr)
    {
        DebugMessageCallback(IsFatal ? DEBUG_MESSAGE_SEVERITY_FATAL_ERROR : DEBUG_MESSAGE_SEVERITY_ERROR, Msg.c_str(), Function, FileName.c_str(), Line);
    }
    else
    {
        // No callback set - output to cerr
        std::cerr << "Diligent Engine: " << (IsFatal ? "Fatal Error" : "Error") << " in " << Function << "() (" << FileName << ", " << Line << "): " << Msg << '\n';
    }
    ThrowIf<bThrowException>(std::move(Msg));
}